

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

void __thiscall hwnet::Poller::Enable(Poller *this,Ptr *channel,int flag)

{
  iterator iVar1;
  int local_2c;
  
  std::mutex::lock(&this->mtx);
  local_2c = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _vptr_Channel[1])();
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->channels)._M_h,&local_2c);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    Epoll::Enable(&this->poller_,channel,flag);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Poller::Enable(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) == this->channels.end()) {
		return;
	} else {
		poller_.Enable(channel,flag);
	}
}